

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O0

void VerticalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  undefined4 in_ECX;
  int in_ESI;
  undefined8 in_RDI;
  uint8_t *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  DoVerticalFilter_C(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,
                     (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

static void VerticalFilter_C(const uint8_t* WEBP_RESTRICT data,
                             int width, int height, int stride,
                             uint8_t* WEBP_RESTRICT filtered_data) {
  DoVerticalFilter_C(data, width, height, stride, filtered_data);
}